

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_scanComment(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  ulong uVar7;
  
  iVar5 = -1;
  if (1 < (long)end - (long)ptr) {
    iVar4 = 0;
    iVar5 = 0;
    if ((*ptr == '\0') && (iVar5 = iVar4, ptr[1] == '-')) {
      pbVar1 = (byte *)(ptr + 2);
LAB_00450251:
      do {
        while( true ) {
          pbVar6 = pbVar1;
          uVar7 = (long)end - (long)pbVar6;
          if ((long)uVar7 < 2) {
            return -1;
          }
          bVar2 = *pbVar6;
          if (3 < bVar2 - 0xd8) break;
switchD_004502d3_caseD_7:
          if (uVar7 < 4) {
            return -2;
          }
          pbVar1 = pbVar6 + 4;
        }
        ptr = (char *)pbVar6;
        if (bVar2 != 0) {
          if (bVar2 == 0xff) {
            if (0xfd < pbVar6[1]) goto switchD_004502d3_caseD_0;
          }
          else if (bVar2 - 0xdc < 4) goto switchD_004502d3_caseD_0;
switchD_004502d3_caseD_2:
          pbVar1 = pbVar6 + 2;
          goto LAB_00450251;
        }
        cVar3 = *(char *)((long)enc[1].scanners + (ulong)pbVar6[1]);
        switch(cVar3) {
        case '\0':
        case '\x01':
        case '\b':
          goto switchD_004502d3_caseD_0;
        case '\x02':
        case '\x03':
        case '\x04':
        case '\x05':
          goto switchD_004502d3_caseD_2;
        case '\x06':
          if (uVar7 == 2) {
            return -2;
          }
          pbVar1 = pbVar6 + 3;
          goto LAB_00450251;
        case '\a':
          goto switchD_004502d3_caseD_7;
        }
        if (cVar3 != '\x1b') goto switchD_004502d3_caseD_2;
        pbVar1 = pbVar6 + 2;
        if ((long)end - (long)pbVar1 < 2) {
          return -1;
        }
      } while ((*pbVar1 != 0) || (pbVar6[3] != 0x2d));
      ptr = (char *)(pbVar6 + 4);
      if ((long)end - (long)ptr < 2) {
        return -1;
      }
      iVar5 = 0;
      if (*ptr == 0) {
        if (pbVar6[5] == 0x3e) {
          ptr = (char *)(pbVar6 + 6);
        }
        iVar5 = 0xd;
        if (pbVar6[5] != 0x3e) {
          iVar5 = 0;
        }
      }
    }
switchD_004502d3_caseD_0:
    *nextTokPtr = ptr;
  }
  return iVar5;
}

Assistant:

static int PTRCALL
PREFIX(scanComment)(const ENCODING *enc, const char *ptr,
                    const char *end, const char **nextTokPtr)
{
  if (HAS_CHAR(enc, ptr, end)) {
    if (!CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
    ptr += MINBPC(enc);
    while (HAS_CHAR(enc, ptr, end)) {
      switch (BYTE_TYPE(enc, ptr)) {
      INVALID_CASES(ptr, nextTokPtr)
      case BT_MINUS:
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        if (CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_COMMENT;
        }
        break;
      default:
        ptr += MINBPC(enc);
        break;
      }
    }
  }
  return XML_TOK_PARTIAL;
}